

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall
Application::onMessage(Application *this,OrderCancelRequest *message,SessionID *param_2)

{
  Side side_00;
  Side side;
  Symbol symbol;
  OrigClOrdID origClOrdID;
  FieldBase local_120;
  FieldBase local_c8;
  FieldBase local_70;
  
  FIX::StringField::StringField((StringField *)&local_70,0x29);
  local_70._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b648;
  FIX::StringField::StringField((StringField *)&local_c8,0x37);
  local_c8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b408;
  FIX::CharField::CharField((CharField *)&local_120,0x36);
  local_120._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0015b440;
  FIX::FieldMap::getField((FieldMap *)message,&local_70);
  FIX::FieldMap::getField((FieldMap *)message,&local_c8);
  FIX::FieldMap::getField((FieldMap *)message,&local_120);
  side_00 = convert((Application *)message,(Side *)&local_120);
  processCancel(this,&local_70.m_string,&local_c8.m_string,side_00);
  FIX::FieldBase::~FieldBase(&local_120);
  FIX::FieldBase::~FieldBase(&local_c8);
  FIX::FieldBase::~FieldBase(&local_70);
  return;
}

Assistant:

void Application::onMessage(const FIX42::OrderCancelRequest &message, const FIX::SessionID &) {
  FIX::OrigClOrdID origClOrdID;
  FIX::Symbol symbol;
  FIX::Side side;

  message.get(origClOrdID);
  message.get(symbol);
  message.get(side);

  try {
    processCancel(origClOrdID, symbol, convert(side));
  } catch (std::exception &) {}
}